

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_float(coda_cursor *cursor,float *dst)

{
  int iVar1;
  char *pcVar2;
  double local_60;
  double value_9;
  uint64_t value_8;
  int64_t value_7;
  uint32_t value_6;
  int32_t value_5;
  uint16_t value_4;
  int16_t value_3;
  uint8_t value_2;
  double dStack_38;
  int8_t value_1;
  double value;
  coda_conversion *conversion;
  float *pfStack_20;
  coda_native_type read_type;
  float *dst_local;
  coda_cursor *cursor_local;
  
  pfStack_20 = dst;
  dst_local = (float *)cursor;
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x947);
    cursor_local._4_4_ = -1;
  }
  else if (dst == (float *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0x94c);
    cursor_local._4_4_ = -1;
  }
  else {
    iVar1 = get_unconverted_read_type
                      (cursor,(coda_native_type *)((long)&conversion + 4),(coda_conversion **)&value
                      );
    if (iVar1 == 0) {
      if (value == 0.0) {
        switch(conversion._4_4_) {
        case coda_native_type_int8:
          iVar1 = read_int8((coda_cursor *)dst_local,(int8_t *)((long)&value_5 + 3));
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)(int)value_5._3_1_;
          break;
        case coda_native_type_uint8:
          iVar1 = read_uint8((coda_cursor *)dst_local,(uint8_t *)((long)&value_5 + 2));
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)value_5._2_1_;
          break;
        case coda_native_type_int16:
          iVar1 = read_int16((coda_cursor *)dst_local,(int16_t *)&value_5);
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)(int)(short)value_5;
          break;
        case coda_native_type_uint16:
          iVar1 = read_uint16((coda_cursor *)dst_local,(uint16_t *)((long)&value_6 + 2));
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)value_6._2_2_;
          break;
        case coda_native_type_int32:
          iVar1 = read_int32((coda_cursor *)dst_local,(int32_t *)((long)&value_7 + 4));
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)value_7._4_4_;
          break;
        case coda_native_type_uint32:
          iVar1 = read_uint32((coda_cursor *)dst_local,(uint32_t *)&value_7);
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)(uint)value_7;
          break;
        case coda_native_type_int64:
          iVar1 = read_int64((coda_cursor *)dst_local,(int64_t *)&value_8);
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)(long)value_8;
          break;
        case coda_native_type_uint64:
          iVar1 = read_uint64((coda_cursor *)dst_local,(uint64_t *)&value_9);
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)(long)value_9;
          break;
        case coda_native_type_float:
          iVar1 = read_float((coda_cursor *)dst_local,pfStack_20);
          if (iVar1 != 0) {
            return -1;
          }
          break;
        case coda_native_type_double:
          iVar1 = read_double((coda_cursor *)dst_local,&local_60);
          if (iVar1 != 0) {
            return -1;
          }
          *pfStack_20 = (float)local_60;
          break;
        default:
          pcVar2 = coda_type_get_native_type_name(conversion._4_4_);
          coda_set_error(-0x69,"can not read %s data using a float data type",pcVar2);
          return -1;
        }
        cursor_local._4_4_ = 0;
      }
      else {
        iVar1 = coda_cursor_read_double((coda_cursor *)dst_local,&stack0xffffffffffffffc8);
        if (iVar1 == 0) {
          *pfStack_20 = (float)dStack_38;
          cursor_local._4_4_ = 0;
        }
        else {
          cursor_local._4_4_ = -1;
        }
      }
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_native_type read_type;
    coda_conversion *conversion;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (get_unconverted_read_type(cursor, &read_type, &conversion) != 0)
    {
        return -1;
    }
    if (conversion != NULL)
    {
        double value;

        /* let the conversion be performed by coda_cursor_read_double() and cast the result */
        if (coda_cursor_read_double(cursor, &value) != 0)
        {
            return -1;
        }
        *dst = (float)value;
        return 0;
    }
    switch (read_type)
    {
        case coda_native_type_int8:
            {
                int8_t value;

                if (read_int8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint8:
            {
                uint8_t value;

                if (read_uint8(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int16:
            {
                int16_t value;

                if (read_int16(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint16:
            {
                uint16_t value;

                if (read_uint16(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int32:
            {
                int32_t value;

                if (read_int32(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint32:
            {
                uint32_t value;

                if (read_uint32(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_int64:
            {
                int64_t value;

                if (read_int64(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        case coda_native_type_uint64:
            {
                uint64_t value;

                if (read_uint64(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)(int64_t)value;
            }
            break;
        case coda_native_type_float:
            if (read_float(cursor, dst) != 0)
            {
                return -1;
            }
            break;
        case coda_native_type_double:
            {
                double value;

                if (read_double(cursor, &value) != 0)
                {
                    return -1;
                }
                *dst = (float)value;
            }
            break;
        default:
            coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read %s data using a float data type",
                           coda_type_get_native_type_name(read_type));
            return -1;
    }

    return 0;
}